

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgaussrule.cpp
# Opt level: O3

void __thiscall TPZGaussRule::SetType(TPZGaussRule *this,int *type,int order)

{
  TPZVec<long_double> *this_00;
  TPZVec<long_double> *this_01;
  int iVar1;
  int iVar2;
  int iVar3;
  TPZGaussRule *this_02;
  
  iVar1 = 1;
  if (-1 < order) {
    iVar1 = order;
  }
  if (3 < (uint)*type) {
    *type = 0;
  }
  this_00 = &this->fLocation;
  TPZVec<long_double>::Resize(this_00,0);
  this_01 = &this->fWeight;
  this_02 = (TPZGaussRule *)this_01;
  TPZVec<long_double>::Resize(this_01,0);
  iVar2 = *type;
  this->fType = iVar2;
  if (iVar2 == 3) {
    ComputingGaussChebyshevQuadrature(this,iVar1);
    return;
  }
  if (iVar2 == 2) {
    iVar2 = (int)((double)(iVar1 + 2) * 0.51);
    iVar1 = 1;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    this->fNumInt = iVar1;
    ComputingGaussJacobiQuadrature(this_02,&this->fNumInt,this->fAlpha,this->fBeta,this_00,this_01);
  }
  else {
    if (iVar2 == 1) {
      iVar1 = ComputingGaussLobattoQuadrature(this,iVar1);
    }
    else {
      iVar2 = (int)((double)(iVar1 + 2) * 0.51);
      iVar1 = 1;
      if (1 < iVar2) {
        iVar1 = iVar2;
      }
      iVar3 = 999;
      if (iVar2 < 0x3e9) {
        iVar3 = iVar1;
      }
      this->fNumInt = iVar3;
      iVar1 = iVar3 * 2 + -2;
      ComputingGaussLegendreQuadrature(this_02,&this->fNumInt,this_00,this_01);
    }
    if (iVar1 < 0) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Integral/tpzgaussrule.cpp"
                 ,0xa4);
    }
  }
  return;
}

Assistant:

void TPZGaussRule::SetType(int &type,int order) {
	if(order < 0) order = 1;
	if(type < 0 || type > 3) type = 0;
		fLocation.Resize(0);
		fWeight.Resize(0);
		fType = type;
    int neworder;
		switch(type) {
			case 1:   // Lobatto
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLobattoQuadrature(order);
			}
				break;
			case 2:   // Jacobi
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussJacobiQuadrature(order,fAlpha,fBeta);
			}
				break;
			case 3:  // Chebyshev
			{
				neworder=ComputingGaussChebyshevQuadrature(order);
			}
				break;
			default:     // Legendre (default)
			{
				// Computing the points and weights for the symmetric Gaussian quadrature (using Legendre polynomials) 
				neworder=ComputingGaussLegendreQuadrature(order);
			}
				break;
		}
    if(neworder < 0)
        DebugStop();
}